

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O2

void __thiscall QEasingCurve::QEasingCurve(QEasingCurve *this,QEasingCurve *other)

{
  QEasingCurvePrivate *this_00;
  
  this_00 = (QEasingCurvePrivate *)operator_new(0x18);
  QEasingCurvePrivate::QEasingCurvePrivate(this_00,other->d_ptr);
  this->d_ptr = this_00;
  return;
}

Assistant:

QEasingCurve::QEasingCurve(const QEasingCurve &other)
    : d_ptr(new QEasingCurvePrivate(*other.d_ptr))
{
    // ### non-atomic, requires malloc on shallow copy
}